

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

uint __thiscall CodeGenGenericContext::MemFind(CodeGenGenericContext *this,x86Argument *address)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = 1;
  for (lVar3 = 0;
      (uVar1 = 0, lVar3 != 0x480 &&
      ((((*(int *)((long)&this->memCache[0].value.type + lVar3) == 0 ||
         (*(int *)((long)&this->memCache[0].address.type + lVar3) == 0)) ||
        (*(x86Reg *)((long)&this->memCache[0].address.field_1 + lVar3) != (address->field_1).reg))
       || (((*(int *)((long)&this->memCache[0].address.ptrNum + lVar3) != address->ptrNum ||
            (*(x86Reg *)((long)&this->memCache[0].address.ptrBase + lVar3) != address->ptrBase)) ||
           (uVar1 = uVar2,
           *(x86Reg *)((long)&this->memCache[0].address.ptrIndex + lVar3) != address->ptrIndex))))))
      ; lVar3 = lVar3 + 0x48) {
    uVar2 = uVar2 + 1;
  }
  return uVar1;
}

Assistant:

unsigned CodeGenGenericContext::MemFind(const x86Argument &address)
{
	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.value.type != x86Argument::argNone && entry.address.type != x86Argument::argNone && entry.address.ptrSize == address.ptrSize && entry.address.ptrNum == address.ptrNum && entry.address.ptrBase == address.ptrBase && entry.address.ptrIndex == address.ptrIndex)
			return i + 1;
	}

	return 0;
}